

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O3

float SrgbTransform::linearToSrgb(float x)

{
  float fVar1;
  
  fVar1 = 0.0;
  if ((0.0 < x) && (fVar1 = 1.0, x < 1.0)) {
    if (0.0031308 <= x) {
      fVar1 = powf(x,0.41666666);
      fVar1 = fVar1 * 1.055 + -0.055;
    }
    else {
      fVar1 = x * 12.92;
    }
  }
  return fVar1;
}

Assistant:

float linearToSrgb(float x) {
	if (x <= 0.0f)
		return 0.0f;
	else if (x >= 1.0f)
		return 1.0f;
	else if (x < 0.0031308f)
		return x * 12.92f;
	else
		return std::pow(x, 1.0f / 2.4f) * 1.055f - 0.055f;
}